

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::~QWidgetWindow(QWidgetWindow *this)

{
  QBackingStore *this_00;
  bool bVar1;
  QTLWExtra *pQVar2;
  
  *(undefined ***)this = &PTR_metaObject_007c2058;
  *(undefined ***)&this->field_0x10 = &PTR__QWidgetWindow_007c2190;
  QWindow::destroy();
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->m_widget);
  if (bVar1) {
    pQVar2 = QWidgetPrivate::topData(*(QWidgetPrivate **)((this->m_widget).wp.value + 8));
    std::__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::reset
              ((__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                *)&pQVar2->repaintManager,(pointer)0x0);
    this_00 = pQVar2->backingStore;
    if (this_00 != (QBackingStore *)0x0) {
      QBackingStore::~QBackingStore(this_00);
    }
    operator_delete(this_00,8);
    pQVar2->backingStore = (QBackingStore *)0x0;
    std::
    vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
    ::clear(&pQVar2->widgetTextures);
    pQVar2->window = (QWidgetWindow *)0x0;
  }
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_dragTarget).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_implicit_mouse_grabber).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_widget).wp);
  QWindow::~QWindow(&this->super_QWindow);
  return;
}

Assistant:

QWidgetWindow::~QWidgetWindow()
{
    // destroy while we are still alive
    destroy();

    if (!m_widget)
        return;

    QTLWExtra *topData = QWidgetPrivate::get(m_widget)->topData();
    Q_ASSERT(topData);

    // The QPlaformBackingStore may hold a reference to the window,
    // so the backingstore needs to be deleted first.
    topData->repaintManager.reset(nullptr);
    delete topData->backingStore;
    topData->backingStore = nullptr;
    topData->widgetTextures.clear();

    // Too late to do anything beyond this point
    topData->window = nullptr;
}